

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_InitHooks(cJSON_Hooks *hooks)

{
  code *pcVar1;
  code *pcVar2;
  
  global_hooks.allocate = malloc;
  if (hooks == (cJSON_Hooks *)0x0) {
    global_hooks.deallocate = free;
  }
  else {
    pcVar1 = hooks->malloc_fn;
    if (pcVar1 == (_func_void_ptr_size_t *)0x0) {
      pcVar1 = malloc;
    }
    pcVar2 = hooks->free_fn;
    if (pcVar2 == (_func_void_void_ptr *)0x0) {
      pcVar2 = free;
    }
    global_hooks.allocate = pcVar1;
    global_hooks.deallocate = pcVar2;
    if (pcVar2 != free || pcVar1 != malloc) {
      global_hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
      return;
    }
  }
  global_hooks.reallocate = realloc;
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_InitHooks(cJSON_Hooks* hooks)
{
    if (hooks == NULL)
    {
        /* Reset hooks */
        global_hooks.allocate = malloc;
        global_hooks.deallocate = free;
        global_hooks.reallocate = realloc;
        return;
    }

    global_hooks.allocate = malloc;
    if (hooks->malloc_fn != NULL)
    {
        global_hooks.allocate = hooks->malloc_fn;
    }

    global_hooks.deallocate = free;
    if (hooks->free_fn != NULL)
    {
        global_hooks.deallocate = hooks->free_fn;
    }

    /* use realloc only if both free and malloc are used */
    global_hooks.reallocate = NULL;
    if ((global_hooks.allocate == malloc) && (global_hooks.deallocate == free))
    {
        global_hooks.reallocate = realloc;
    }
}